

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item.cxx
# Opt level: O0

int __thiscall Fl_Tree_Item::swap_children(Fl_Tree_Item *this,Fl_Tree_Item *a,Fl_Tree_Item *b)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_Tree_Item *pFVar4;
  int local_34;
  int local_30;
  int t;
  int bx;
  int ax;
  Fl_Tree_Item *b_local;
  Fl_Tree_Item *a_local;
  Fl_Tree_Item *this_local;
  
  t = -1;
  local_30 = -1;
  local_34 = 0;
  while ((iVar3 = children(this), local_34 < iVar3 &&
         (((pFVar4 = Fl_Tree_Item_Array::operator[](&this->_children,local_34), iVar1 = local_30,
           iVar2 = local_34, iVar3 = local_30, pFVar4 != a &&
           (pFVar4 = Fl_Tree_Item_Array::operator[](&this->_children,local_34), iVar1 = local_34,
           iVar2 = t, iVar3 = t, pFVar4 != b)) || (t = iVar2, local_30 = iVar1, iVar3 == -1))))) {
    local_34 = local_34 + 1;
  }
  if ((t == -1) || (local_30 == -1)) {
    this_local._4_4_ = -1;
  }
  else {
    swap_children(this,t,local_30);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Tree_Item::swap_children(Fl_Tree_Item *a, Fl_Tree_Item *b) {
  int ax = -1, bx = -1;
  for ( int t=0; t<children(); t++ ) {	// find index for a and b
    if ( _children[t] == a ) { ax = t; if ( bx != -1 ) break; else continue; }
    if ( _children[t] == b ) { bx = t; if ( ax != -1 ) break; else continue; }
  }
  if ( ax == -1 || bx == -1 ) return(-1);	// not found? fail
  swap_children(ax,bx);
  return(0);
}